

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  LogMessage *pLVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar5;
  byte *pbVar6;
  LogFinisher local_59;
  LogMessage local_58;
  int iVar4;
  
  iVar5 = (int)this->buffer_;
  iVar4 = (int)this->buffer_end_;
  iVar3 = iVar4 - iVar5;
  if (9 < iVar3) {
LAB_0031b19d:
    if (*this->buffer_ != first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x219);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (first_byte_or_zero) == (buffer_[0]): ");
      internal::LogFinisher::operator=(&local_59,pLVar1);
      internal::LogMessage::~LogMessage(&local_58);
    }
    pbVar6 = this->buffer_;
    if (first_byte_or_zero == 0) {
      this->buffer_ = pbVar6 + 1;
      return 0;
    }
    if (*pbVar6 != first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x175);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (*buffer) == (first_byte): ");
      internal::LogFinisher::operator=(&local_59,pLVar1);
      internal::LogMessage::~LogMessage(&local_58);
    }
    if (-1 < (char)first_byte_or_zero) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x176);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: (first_byte & 0x80) == (0x80): ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,first_byte_or_zero);
      internal::LogFinisher::operator=(&local_59,pLVar1);
      internal::LogMessage::~LogMessage(&local_58);
    }
    uVar2 = ((uint)pbVar6[1] * 0x80 + first_byte_or_zero) - 0x80;
    if ((char)pbVar6[1] < '\0') {
      uVar2 = (uVar2 + (uint)pbVar6[2] * 0x4000) - 0x4000;
      if ((char)pbVar6[2] < '\0') {
        uVar2 = (uVar2 + (uint)pbVar6[3] * 0x200000) - 0x200000;
        if ((char)pbVar6[3] < '\0') {
          uVar2 = uVar2 + (uint)pbVar6[4] * 0x10000000 + 0xf0000000;
          if ((char)pbVar6[4] < '\0') {
            pbVar6 = pbVar6 + 6;
            iVar5 = 5;
            while ((char)pbVar6[-1] < '\0') {
              pbVar6 = pbVar6 + 1;
              iVar5 = iVar5 + -1;
              if (iVar5 == 0) {
                return 0;
              }
            }
          }
          else {
            pbVar6 = pbVar6 + 5;
          }
        }
        else {
          pbVar6 = pbVar6 + 4;
        }
      }
      else {
        pbVar6 = pbVar6 + 3;
      }
    }
    else {
      pbVar6 = pbVar6 + 2;
    }
    this->buffer_ = pbVar6;
    return uVar2;
  }
  if (iVar3 < 1) {
    if (iVar4 == iVar5) {
      if (((0 < this->buffer_size_after_limit_) || (this->total_bytes_read_ == this->current_limit_)
          ) && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)
         ) {
        this->legitimate_message_end_ = true;
        return 0;
      }
    }
  }
  else if (-1 < (char)this->buffer_end_[-1]) goto LAB_0031b19d;
  uVar2 = ReadTagSlow(this);
  return uVar2;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}